

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

int OpenSSL_client_verify_callback(int preverify_ok,X509_STORE_CTX *x509_ctx)

{
  int iVar1;
  int idx;
  uint uVar2;
  uint uVar3;
  SSL *pSVar4;
  void *pvVar5;
  char *pcVar6;
  char *msg;
  int depth;
  int err_1;
  int err;
  lws *wsi;
  int n;
  SSL *ssl;
  X509_STORE_CTX *x509_ctx_local;
  int preverify_ok_local;
  
  if ((preverify_ok == 0) &&
     (iVar1 = X509_STORE_CTX_get_error((X509_STORE_CTX *)x509_ctx), iVar1 != 0)) {
    idx = SSL_get_ex_data_X509_STORE_CTX_idx();
    pSVar4 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)x509_ctx,idx);
    pvVar5 = SSL_get_ex_data(pSVar4,openssl_websocket_private_data_index);
    if (pvVar5 == (void *)0x0) {
      _lws_log(1,"%s: can\'t get wsi from ssl privdata\n","OpenSSL_client_verify_callback");
      return 0;
    }
    if (((iVar1 == 0x12) || (iVar1 == 0x13)) && ((*(uint *)((long)pvVar5 + 0x2b8) & 2) != 0)) {
      _lws_log(4,"accepting self-signed certificate (verify_callback)\n");
      X509_STORE_CTX_set_error((X509_STORE_CTX *)x509_ctx,0);
      return 1;
    }
    if (((iVar1 == 0x14) || (iVar1 == 0x15)) && ((*(uint *)((long)pvVar5 + 0x2b8) & 0x10) != 0)) {
      _lws_log(4,"accepting non-trusted certificate\n");
      X509_STORE_CTX_set_error((X509_STORE_CTX *)x509_ctx,0);
      return 1;
    }
    if (((iVar1 == 9) || (iVar1 == 10)) && ((*(uint *)((long)pvVar5 + 0x2b8) & 8) != 0)) {
      if (iVar1 == 9) {
        _lws_log(4,"accepting not yet valid certificate (verify_callback)\n");
      }
      else if (iVar1 == 10) {
        _lws_log(4,"accepting expired certificate (verify_callback)\n");
      }
      X509_STORE_CTX_set_error((X509_STORE_CTX *)x509_ctx,0);
      return 1;
    }
  }
  iVar1 = SSL_get_ex_data_X509_STORE_CTX_idx();
  pSVar4 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)x509_ctx,iVar1);
  pvVar5 = SSL_get_ex_data(pSVar4,openssl_websocket_private_data_index);
  if (pvVar5 == (void *)0x0) {
    _lws_log(1,"%s: can\'t get wsi from ssl privdata\n","OpenSSL_client_verify_callback");
    x509_ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = (**(code **)(*(long *)(*(long *)(*(long *)((long)pvVar5 + 0x1f8) + 0x420) + 0x1a0) + 8))
                      (pvVar5,0x3a,x509_ctx,pSVar4,(long)preverify_ok);
    if ((preverify_ok == 0) &&
       (uVar2 = X509_STORE_CTX_get_error((X509_STORE_CTX *)x509_ctx), uVar2 != 0)) {
      uVar3 = X509_STORE_CTX_get_error_depth((X509_STORE_CTX *)x509_ctx);
      pcVar6 = X509_verify_cert_error_string((long)(int)uVar2);
      _lws_log(1,"SSL error: %s (preverify_ok=%d;err=%d;depth=%d)\n",pcVar6,0,(ulong)uVar2,
               (ulong)uVar3);
      x509_ctx_local._4_4_ = 0;
    }
    else {
      x509_ctx_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
  }
  return x509_ctx_local._4_4_;
}

Assistant:

static int
OpenSSL_client_verify_callback(int preverify_ok, X509_STORE_CTX *x509_ctx)
{
	SSL *ssl;
	int n;
	struct lws *wsi;

	/* keep old behaviour accepting self-signed server certs */
	if (!preverify_ok) {
		int err = X509_STORE_CTX_get_error(x509_ctx);

		if (err != X509_V_OK) {
			ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
					SSL_get_ex_data_X509_STORE_CTX_idx());
			wsi = SSL_get_ex_data(ssl,
					openssl_websocket_private_data_index);
			if (!wsi) {
				lwsl_err("%s: can't get wsi from ssl privdata\n",
					 __func__);

				return 0;
			}

			if ((err == X509_V_ERR_DEPTH_ZERO_SELF_SIGNED_CERT ||
			     err == X509_V_ERR_SELF_SIGNED_CERT_IN_CHAIN) &&
			     wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED) {
				lwsl_notice("accepting self-signed "
					    "certificate (verify_callback)\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;	// ok
		} else if ((err == X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY ||
			    err == X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE) &&
			    wsi->tls.use_ssl & LCCSCF_ALLOW_INSECURE) {
				lwsl_notice("accepting non-trusted certificate\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;  /* ok */
			} else if ((err == X509_V_ERR_CERT_NOT_YET_VALID ||
				    err == X509_V_ERR_CERT_HAS_EXPIRED) &&
				    wsi->tls.use_ssl & LCCSCF_ALLOW_EXPIRED) {
				if (err == X509_V_ERR_CERT_NOT_YET_VALID)
					lwsl_notice("accepting not yet valid "
						    "certificate (verify_"
						    "callback)\n");
				else if (err == X509_V_ERR_CERT_HAS_EXPIRED)
					lwsl_notice("accepting expired "
						    "certificate (verify_"
						    "callback)\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;	// ok
			}
		}
	}

	ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
					 SSL_get_ex_data_X509_STORE_CTX_idx());
	wsi = SSL_get_ex_data(ssl, openssl_websocket_private_data_index);
	if (!wsi) {
		lwsl_err("%s: can't get wsi from ssl privdata\n",  __func__);

		return 0;
	}

	n = lws_get_context_protocol(wsi->context, 0).callback(wsi,
			LWS_CALLBACK_OPENSSL_PERFORM_SERVER_CERT_VERIFICATION,
			x509_ctx, ssl, preverify_ok);

	/* keep old behaviour if something wrong with server certs */
	/* if ssl error is overruled in callback and cert is ok,
	 * X509_STORE_CTX_set_error(x509_ctx, X509_V_OK); must be set and
	 * return value is 0 from callback */
	if (!preverify_ok) {
		int err = X509_STORE_CTX_get_error(x509_ctx);

		if (err != X509_V_OK) {
			/* cert validation error was not handled in callback */
			int depth = X509_STORE_CTX_get_error_depth(x509_ctx);
			const char *msg = X509_verify_cert_error_string(err);

			lwsl_err("SSL error: %s (preverify_ok=%d;err=%d;"
				 "depth=%d)\n", msg, preverify_ok, err, depth);

			return preverify_ok;	// not ok
		}
	}
	/*
	 * convert callback return code from 0 = OK to verify callback
	 * return value 1 = OK
	 */
	return !n;
}